

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileParser::getNewMaterial(ObjFileParser *this)

{
  Model *pMVar1;
  bool bVar2;
  uint uVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  byte *pbVar5;
  iterator iVar6;
  Logger *this_00;
  string strMat;
  key_type local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var4._M_current;
  _Var4 = getNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    (_Var4,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var4._M_current;
  if (_Var4._M_current != (this->m_DataItEnd)._M_current) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,_Var4._M_current,_Var4._M_current + *_Var4._M_current);
    pbVar5 = (byte *)(this->m_DataIt)._M_current;
    while (((pbVar5 != (byte *)(this->m_DataItEnd)._M_current && ((ulong)*pbVar5 < 0x21)) &&
           ((0x100003601U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
      pbVar5 = pbVar5 + 1;
      (this->m_DataIt)._M_current = (char *)pbVar5;
    }
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
            ::find(&(((this->m_pModel)._M_t.
                      super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                      .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                    m_MaterialMap)._M_t,&local_50);
    if (iVar6._M_node ==
        (_Base_ptr)
        ((long)&(((this->m_pModel)._M_t.
                  super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                  .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_MaterialMap)._M_t + 8U)) {
      this_00 = DefaultLogger::get();
      std::operator+(&local_30,"OBJ: Unsupported material requested: ",&local_50);
      Logger::warn(this_00,local_30._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_30);
      pMVar1 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      pMVar1->m_pCurrentMaterial = pMVar1->m_pDefaultMaterial;
    }
    else {
      bVar2 = needsNewMesh(this,&local_50);
      if (bVar2) {
        createMesh(this,&local_50);
      }
      uVar3 = getMaterialIndex(this,&local_50);
      ((this->m_pModel)._M_t.
       super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>.
       _M_t.
       super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
       .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->m_pCurrentMesh->
      m_uiMaterialIndex = uVar3;
    }
    _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
    (this->m_DataIt)._M_current = _Var4._M_current;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void ObjFileParser::getNewMaterial() {
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    m_DataIt = getNextWord<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }

    char *pStart = &(*m_DataIt);
    std::string strMat( pStart, *m_DataIt );
    while( m_DataIt != m_DataItEnd && IsSpaceOrNewLine( *m_DataIt ) ) {
        ++m_DataIt;
    }
    std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find( strMat );
    if ( it == m_pModel->m_MaterialMap.end() ) {
        // Show a warning, if material was not found
        ASSIMP_LOG_WARN("OBJ: Unsupported material requested: " + strMat);
        m_pModel->m_pCurrentMaterial = m_pModel->m_pDefaultMaterial;
    } else {
        // Set new material
        if ( needsNewMesh( strMat ) ) {
            createMesh( strMat );
        }
        m_pModel->m_pCurrentMesh->m_uiMaterialIndex = getMaterialIndex( strMat );
    }

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}